

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  char_t *pcVar5;
  char_t *from_00;
  xpath_context *in_RCX;
  xpath_ast_node *in_RDX;
  undefined1 *in_RSI;
  xpath_string *in_RDI;
  double value;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  xpath_node_set_raw ns_3;
  xpath_stack swapped_stack_5;
  xpath_allocator_capture cr_8;
  char_t *end_4;
  char_t *begin_3;
  xpath_string s_7;
  char_t *end_3;
  char_t *begin_2;
  xpath_string to;
  xpath_string from;
  xpath_string s_6;
  xpath_stack swapped_stack_4;
  xpath_allocator_capture cr_7;
  char_t *end_2;
  char_t *begin_1;
  xpath_string s_5;
  char_t *end_1;
  char_t *begin;
  xpath_string s_4;
  char_t *rend_2;
  char_t *rbegin_2;
  size_t end;
  size_t pos_3;
  double last;
  double first_1;
  size_t s_length_1;
  xpath_string s_3;
  xpath_stack swapped_stack_3;
  xpath_allocator_capture cr_6;
  char_t *rend_1;
  char_t *rbegin_1;
  size_t pos_2;
  double first;
  size_t s_length;
  xpath_string s_2;
  xpath_stack swapped_stack_2;
  xpath_allocator_capture cr_5;
  char_t *rend;
  char_t *rbegin;
  char_t *pos_1;
  xpath_string p_1;
  xpath_string s_1;
  xpath_stack swapped_stack_1;
  xpath_allocator_capture cr_4;
  char_t *pos;
  xpath_string p;
  xpath_string s;
  xpath_stack swapped_stack;
  xpath_allocator_capture cr_3;
  xpath_node na_5;
  xpath_node_set_raw ns_2;
  xpath_allocator_capture cr_2;
  xpath_node na_4;
  xpath_node na_3;
  xpath_node_set_raw ns_1;
  xpath_allocator_capture cr_1;
  xpath_node na_2;
  xpath_node na_1;
  xpath_node_set_raw ns;
  xpath_allocator_capture cr;
  xpath_node na;
  char_t *in_stack_fffffffffffff9e8;
  xpath_string *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  xpath_allocator *in_stack_fffffffffffffa00;
  xpath_string *in_stack_fffffffffffffa08;
  xpath_node *in_stack_fffffffffffffa10;
  ulong local_5b8;
  xpath_allocator *in_stack_fffffffffffffa58;
  double in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  xpath_node *in_stack_fffffffffffffa90;
  ulong local_558;
  xpath_stack *in_stack_fffffffffffffae0;
  xpath_context *in_stack_fffffffffffffae8;
  xpath_ast_node *in_stack_fffffffffffffaf0;
  xpath_context *in_stack_fffffffffffffaf8;
  xpath_ast_node *in_stack_fffffffffffffb00;
  xpath_node_set_raw local_470;
  xml_attribute_struct *local_450;
  xml_node_struct *local_448;
  xpath_allocator_capture local_440;
  char_t *local_420;
  char_t *local_418;
  char_t *local_3f8;
  char_t *local_3f0;
  xpath_stack *in_stack_fffffffffffffc28;
  xpath_context *in_stack_fffffffffffffc30;
  xpath_ast_node *in_stack_fffffffffffffc38;
  xpath_allocator_capture local_390;
  char_t *local_370;
  char_t *local_368;
  xpath_stack *in_stack_fffffffffffffca8;
  xpath_context *in_stack_fffffffffffffcb0;
  xpath_ast_node *in_stack_fffffffffffffcb8;
  xpath_string local_2e8;
  xml_attribute_struct *local_2d0;
  xml_node_struct *local_2c8;
  xpath_allocator_capture local_2c0;
  char_t *local_2a0;
  char_t *local_298;
  ulong local_290;
  double local_288;
  size_t local_280;
  xpath_string local_278;
  xml_attribute_struct *local_260;
  xml_node_struct *local_258;
  xpath_allocator_capture local_250;
  char_t *local_230;
  char_t *local_228;
  undefined4 local_21c;
  char_t *local_218;
  xpath_string local_210;
  xpath_string local_1f8;
  xml_attribute_struct *local_1e0;
  xml_node_struct *local_1d8;
  xpath_allocator_capture local_1d0;
  char_t *local_1b0;
  xpath_string local_1a8;
  xpath_string local_190;
  xml_attribute_struct *local_178;
  xml_node_struct *local_170;
  xpath_allocator_capture local_168;
  xpath_node local_148;
  xpath_allocator_capture local_118;
  undefined8 local_f8;
  xpath_ast_node *local_f0;
  xpath_node local_e8;
  xpath_allocator_capture local_b8;
  undefined8 local_98;
  xpath_ast_node *local_90;
  xpath_node local_88;
  xpath_allocator_capture local_48;
  undefined8 local_28;
  xpath_stack *in_stack_ffffffffffffffe0;
  
  switch(*in_RSI) {
  case 0x12:
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    break;
  case 0x14:
    if (in_RSI[1] == '\x03') {
      xpath_variable::get_string(*(xpath_variable **)(in_RSI + 0x20));
      xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
      return in_RDI;
    }
  default:
    cVar1 = in_RSI[1];
    if (cVar1 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                (&local_440,(xpath_allocator *)(in_RCX->n)._attribute._attr);
      local_450 = (in_RCX->n)._attribute._attr;
      local_448 = (in_RCX->n)._node._root;
      eval_node_set(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                    (xpath_stack *)in_stack_fffffffffffffaf0,
                    (nodeset_eval_t)((ulong)in_stack_fffffffffffffae8 >> 0x20));
      bVar2 = xpath_node_set_raw::empty(&local_470);
      if (bVar2) {
        xpath_string::xpath_string(in_RDI);
      }
      else {
        xpath_node_set_raw::first((xpath_node_set_raw *)0x12d0e1);
        string_value(in_stack_fffffffffffffa90,
                     (xpath_allocator *)
                     CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
      }
      local_21c = 1;
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12d141);
    }
    else if (cVar1 == '\x02') {
      eval_number(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      convert_number_to_string(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    }
    else if (cVar1 == '\x04') {
      eval_boolean(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    }
    else {
      xpath_string::xpath_string(in_RDI);
    }
    break;
  case 0x19:
    local_28._0_1_ = in_RDX->_type;
    local_28._1_1_ = in_RDX->_rettype;
    local_28._2_1_ = in_RDX->_axis;
    local_28._3_1_ = in_RDX->_test;
    local_28._4_4_ = *(undefined4 *)&in_RDX->field_0x4;
    local_name((xpath_node *)in_stack_fffffffffffffa00);
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    break;
  case 0x1a:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_48,(xpath_allocator *)(in_RCX->n)._node._root);
    eval_node_set(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                  (xpath_stack *)in_stack_fffffffffffffaf0,
                  (nodeset_eval_t)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    local_88 = xpath_node_set_raw::first((xpath_node_set_raw *)0x12bcd5);
    local_name((xpath_node *)in_stack_fffffffffffffa00);
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12bd42);
    break;
  case 0x1b:
    local_f8._0_1_ = in_RDX->_type;
    local_f8._1_1_ = in_RDX->_rettype;
    local_f8._2_1_ = in_RDX->_axis;
    local_f8._3_1_ = in_RDX->_test;
    local_f8._4_4_ = *(undefined4 *)&in_RDX->field_0x4;
    local_f0 = in_RDX->_left;
    namespace_uri(in_stack_fffffffffffffa10);
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    break;
  case 0x1c:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_118,(xpath_allocator *)(in_RCX->n)._node._root);
    eval_node_set(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                  (xpath_stack *)in_stack_fffffffffffffaf0,
                  (nodeset_eval_t)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    local_148 = xpath_node_set_raw::first((xpath_node_set_raw *)0x12bf33);
    namespace_uri(in_stack_fffffffffffffa10);
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12bfa0);
    break;
  case 0x1d:
    local_98._0_1_ = in_RDX->_type;
    local_98._1_1_ = in_RDX->_rettype;
    local_98._2_1_ = in_RDX->_axis;
    local_98._3_1_ = in_RDX->_test;
    local_98._4_4_ = *(undefined4 *)&in_RDX->field_0x4;
    local_90 = in_RDX->_left;
    qualified_name((xpath_node *)in_stack_fffffffffffffa00);
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    break;
  case 0x1e:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_b8,(xpath_allocator *)(in_RCX->n)._node._root);
    eval_node_set(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                  (xpath_stack *)in_stack_fffffffffffffaf0,
                  (nodeset_eval_t)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    local_e8 = xpath_node_set_raw::first((xpath_node_set_raw *)0x12be04);
    qualified_name((xpath_node *)in_stack_fffffffffffffa00);
    xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12be71);
    break;
  case 0x1f:
    string_value(in_stack_fffffffffffffa90,
                 (xpath_allocator *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
    break;
  case 0x20:
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    break;
  case 0x21:
    eval_string_concat(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0
                      );
    break;
  case 0x24:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_168,(xpath_allocator *)(in_RCX->n)._attribute._attr);
    local_178 = (in_RCX->n)._attribute._attr;
    local_170 = (in_RCX->n)._node._root;
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    xpath_string::c_str(&local_190);
    xpath_string::c_str(&local_1a8);
    local_1b0 = find_substring((char_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    if (local_1b0 == (char_t *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      xpath_string::c_str(&local_190);
      xpath_string::from_heap
                ((char_t *)in_stack_fffffffffffffa10,(char_t *)in_stack_fffffffffffffa08,
                 in_stack_fffffffffffffa00);
    }
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12c195);
    break;
  case 0x25:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_1d0,(xpath_allocator *)(in_RCX->n)._attribute._attr);
    local_1e0 = (in_RCX->n)._attribute._attr;
    local_1d8 = (in_RCX->n)._node._root;
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    xpath_string::c_str(&local_1f8);
    xpath_string::c_str(&local_210);
    pcVar5 = find_substring((char_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    local_218 = pcVar5;
    if (pcVar5 == (char_t *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      sVar3 = xpath_string::length(in_stack_fffffffffffff9f0);
      local_228 = pcVar5 + sVar3;
      pcVar5 = xpath_string::c_str(&local_1f8);
      sVar3 = xpath_string::length(in_stack_fffffffffffff9f0);
      local_230 = pcVar5 + sVar3;
      bVar2 = xpath_string::uses_heap(&local_1f8);
      if (bVar2) {
        xpath_string::from_heap
                  ((char_t *)in_stack_fffffffffffffa10,(char_t *)in_stack_fffffffffffffa08,
                   in_stack_fffffffffffffa00);
      }
      else {
        xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
      }
    }
    local_21c = 1;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12c3fc);
    break;
  case 0x26:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_250,(xpath_allocator *)(in_RCX->n)._attribute._attr);
    local_260 = (in_RCX->n)._attribute._attr;
    local_258 = (in_RCX->n)._node._root;
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    local_280 = xpath_string::length(in_stack_fffffffffffff9f0);
    eval_number(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    local_288 = round_nearest(6.07715072288463e-318);
    bVar2 = is_nan(local_288);
    if (bVar2) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      lVar4 = local_280 + 1;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      if (local_288 <
          (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) {
        if (1.0 <= local_288) {
          local_558 = (long)local_288 |
                      (long)(local_288 - 9.223372036854776e+18) & (long)local_288 >> 0x3f;
        }
        else {
          local_558 = 1;
        }
        local_290 = local_558;
        local_298 = xpath_string::c_str(&local_278);
        local_298 = local_298 + (local_290 - 1);
        pcVar5 = xpath_string::c_str(&local_278);
        sVar3 = xpath_string::length(in_stack_fffffffffffff9f0);
        local_2a0 = pcVar5 + sVar3;
        bVar2 = xpath_string::uses_heap(&local_278);
        if (bVar2) {
          xpath_string::from_heap
                    ((char_t *)in_stack_fffffffffffffa10,(char_t *)in_stack_fffffffffffffa08,
                     in_stack_fffffffffffffa00);
        }
        else {
          xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
        }
      }
      else {
        xpath_string::xpath_string(in_RDI);
      }
    }
    local_21c = 1;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12c70b);
    break;
  case 0x27:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_2c0,(xpath_allocator *)(in_RCX->n)._attribute._attr);
    local_2d0 = (in_RCX->n)._attribute._attr;
    local_2c8 = (in_RCX->n)._node._root;
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    sVar3 = xpath_string::length(in_stack_fffffffffffff9f0);
    eval_number(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    value = round_nearest(6.08101925689156e-318);
    dVar7 = value;
    eval_number(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    dVar6 = round_nearest(6.08154296647616e-318);
    dVar7 = dVar7 + dVar6;
    bVar2 = is_nan(value);
    if ((bVar2) || (bVar2 = is_nan(dVar7), bVar2)) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      lVar4 = sVar3 + 1;
      auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = 0x45300000;
      if (value < (auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) {
        if (value < dVar7) {
          if (1.0 <= dVar7) {
            lVar4 = sVar3 + 1;
            auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
            auVar10._0_8_ = lVar4;
            auVar10._12_4_ = 0x45300000;
            if (dVar7 < (auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) {
              local_5b8 = (long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f;
            }
            else {
              local_5b8 = sVar3 + 1;
            }
            xpath_string::c_str(&local_2e8);
            xpath_string::c_str(&local_2e8);
            if ((local_5b8 != sVar3 + 1) || (bVar2 = xpath_string::uses_heap(&local_2e8), bVar2)) {
              xpath_string::from_heap
                        ((char_t *)in_stack_fffffffffffffa10,(char_t *)in_stack_fffffffffffffa08,
                         in_stack_fffffffffffffa00);
            }
            else {
              xpath_string::from_const((char_t *)in_stack_fffffffffffff9f0);
            }
          }
          else {
            xpath_string::xpath_string(in_RDI);
          }
        }
        else {
          xpath_string::xpath_string(in_RDI);
        }
      }
      else {
        xpath_string::xpath_string(in_RDI);
      }
    }
    local_21c = 1;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12cb83);
    break;
  case 0x2a:
    string_value(in_stack_fffffffffffffa90,
                 (xpath_allocator *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
    pcVar5 = xpath_string::data(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    if (pcVar5 == (char_t *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      normalize_space(pcVar5);
      xpath_string::from_heap_preallocated
                ((char_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
    break;
  case 0x2b:
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    local_368 = xpath_string::data(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    if (local_368 == (char_t *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      local_370 = normalize_space(local_368);
      xpath_string::from_heap_preallocated
                ((char_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
    break;
  case 0x2c:
    xpath_allocator_capture::xpath_allocator_capture
              (&local_390,(xpath_allocator *)(in_RCX->n)._attribute._attr);
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    local_3f0 = xpath_string::data(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    if (local_3f0 == (char_t *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      xpath_string::c_str((xpath_string *)&stack0xfffffffffffffc30);
      pcVar5 = xpath_string::c_str((xpath_string *)&stack0xfffffffffffffc18);
      from_00 = (char_t *)xpath_string::length(in_stack_fffffffffffff9f0);
      local_3f8 = translate(pcVar5,from_00,(char_t *)in_stack_fffffffffffffa00,
                            CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      xpath_string::from_heap_preallocated
                ((char_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
    local_21c = 1;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x12cea7);
    break;
  case 0x3a:
    eval_string(in_RDX,in_RCX,in_stack_ffffffffffffffe0);
    local_418 = xpath_string::data(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    if (local_418 == (char_t *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      local_420 = translate_table(local_418,*(uchar **)(in_RSI + 0x20));
      xpath_string::from_heap_preallocated
                ((char_t *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
  }
  return in_RDI;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= s_length + 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= s_length + 1) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= s_length + 1 ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

				case xpath_type_number:
					return convert_number_to_string(eval_number(c, stack), stack.result);

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.temp);

					xpath_stack swapped_stack = {stack.temp, stack.result};

					xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
					return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
				}

				default:
					assert(false && "Wrong expression for return type string"); // unreachable
					return xpath_string();
				}
			}
			}
		}